

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O0

int Abc_NtkRemoveSelfFeedLatches(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pObj;
  int local_28;
  int local_24;
  int Counter;
  int i;
  Abc_Obj_t *pConst1;
  Abc_Obj_t *pLatch;
  Abc_Ntk_t *pNtk_local;
  
  local_28 = 0;
  for (local_24 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = Abc_NtkBox(pNtk,local_24);
    iVar1 = Abc_ObjIsLatch(pAVar2);
    if ((iVar1 != 0) && (iVar1 = Abc_NtkLatchIsSelfFeed(pAVar2), iVar1 != 0)) {
      iVar1 = Abc_NtkIsStrash(pNtk);
      if (iVar1 == 0) {
        _Counter = Abc_NtkCreateNodeConst1(pNtk);
      }
      else {
        _Counter = Abc_AigConst1(pNtk);
      }
      pObj = Abc_ObjFanin0(pAVar2);
      pAVar2 = Abc_ObjFanin0(pAVar2);
      pAVar2 = Abc_ObjFanin0(pAVar2);
      Abc_ObjPatchFanin(pObj,pAVar2,_Counter);
      local_28 = local_28 + 1;
    }
  }
  return local_28;
}

Assistant:

int Abc_NtkRemoveSelfFeedLatches( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pLatch, * pConst1;
    int i, Counter;
    Counter = 0;
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        if ( Abc_NtkLatchIsSelfFeed( pLatch ) )
        {
            if ( Abc_NtkIsStrash(pNtk) )
                pConst1 = Abc_AigConst1(pNtk);
            else
                pConst1 = Abc_NtkCreateNodeConst1(pNtk);
            Abc_ObjPatchFanin( Abc_ObjFanin0(pLatch), Abc_ObjFanin0(Abc_ObjFanin0(pLatch)), pConst1 );
            Counter++;
        }
    }
    return Counter;
}